

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void MetaConst(nodemeta *i,void *Data)

{
  size_t local_38;
  size_t Size;
  void *Data_local;
  nodemeta *i_local;
  
  local_38 = (size_t)ParamSize[(int)(*(uint *)i & 0x3f)];
  if (local_38 == 8) {
    *(uintptr_t *)((long)Data + (long)(int)(*(uint *)i >> 8)) = i->Data;
  }
  else {
    memset((void *)((long)Data + (long)(int)(*(uint *)i >> 8)),0,local_38);
    if (7 < local_38) {
      local_38 = 8;
    }
    memcpy((void *)((long)Data + (long)(int)(*(uint *)i >> 8)),&i->Data,local_38);
  }
  return;
}

Assistant:

static void MetaConst(const nodemeta* i,void* Data)
{
    size_t Size = ParamSize[i->Meta & TYPE_MASK];
    if (Size == sizeof(uintptr_t))
        memcpy((uint8_t*)Data+i->Id,&i->Data,sizeof(uintptr_t));
    else
    {
        memset((uint8_t*)Data+i->Id,0,Size);
        memcpy((uint8_t*)Data+i->Id,&i->Data,MIN(sizeof(uintptr_t),Size));
    }
}